

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O0

bool __thiscall
duckdb::DictionaryDecoder::CanFilter
          (DictionaryDecoder *this,TableFilter *filter,TableFilterState *filter_state)

{
  bool bVar1;
  long in_RDI;
  TableFilterState *in_stack_000000e8;
  TableFilter *in_stack_000000f0;
  DictionaryDecoder *in_stack_000000f8;
  undefined1 local_1;
  
  if (*(long *)(in_RDI + 0x48) == 0) {
    local_1 = false;
  }
  else {
    bVar1 = DictionarySupportsFilter(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool DictionaryDecoder::CanFilter(const TableFilter &filter, TableFilterState &filter_state) {
	if (dictionary_size == 0) {
		return false;
	}
	// We can only push the filter if the filter removes NULL values
	if (!DictionarySupportsFilter(filter, filter_state)) {
		return false;
	}
	return true;
}